

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O1

Status __thiscall spvtools::opt::CodeSinkingPass::Process(CodeSinkingPass *this)

{
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var3;
  IRContext *this_00;
  pointer puVar4;
  bool modified;
  byte local_59;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_59 = 0;
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar4 = *(pointer *)
            &(pMVar1->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  if (puVar4 != puVar2) {
    do {
      _Var3.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
           (puVar4->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
      ;
      this_00 = (this->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(this_00);
      }
      local_58._M_unused._M_object = &local_59;
      pcStack_40 = std::
                   _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp:30:36)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp:30:36)>
                 ::_M_manager;
      local_58._8_8_ = this;
      CFG::ForEachBlockInPostOrder
                ((this_00->cfg_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                 .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,
                 (BasicBlock *)
                 **(undefined8 **)
                   ((long)_Var3.
                          super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                          .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl +
                   0x98),(function<void_(spvtools::opt::BasicBlock_*)> *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
  }
  return local_59 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status CodeSinkingPass::Process() {
  bool modified = false;
  for (Function& function : *get_module()) {
    cfg()->ForEachBlockInPostOrder(function.entry().get(),
                                   [&modified, this](BasicBlock* bb) {
                                     if (SinkInstructionsInBB(bb)) {
                                       modified = true;
                                     }
                                   });
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}